

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CborMap::Get(Error *__return_storage_ptr__,CborMap *this,int aKey,int *aInt)

{
  char cVar1;
  cn_cbor *pcVar2;
  char *to;
  char *from;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  writer write;
  string local_88;
  format_string_checker<char> local_68;
  
  pcVar2 = cn_cbor_mapget_int((this->super_CborValue).mCbor,aKey);
  if (pcVar2 == (cn_cbor *)0x0) {
    local_68.types_[0] = int_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "CBOR map cannot find entry of {}";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x20;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    from = "CBOR map cannot find entry of {}";
    write.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int>_>::
          writer::operator()(&write,from,"");
          goto LAB_0013fdc2;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                       (to,"",&local_68);
    }
LAB_0013fdc2:
    local_68._0_8_ = ZEXT48((uint)aKey);
    fmt.size_ = 1;
    fmt.data_ = (char *)0x20;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_88,(v10 *)"CBOR map cannot find entry of {}",fmt,args);
    __return_storage_ptr__->mCode = kNotFound;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->mMessage,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    *aInt = (int)(pcVar2->v).f;
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Error CborMap::Get(int aKey, int &aInt) const
{
    cn_cbor *cborInt = cn_cbor_mapget_int(mCbor, aKey);
    if (cborInt == nullptr)
    {
        return ERROR_NOT_FOUND("CBOR map cannot find entry of {}", aKey);
    }

    aInt = cborInt->v.sint;
    return ERROR_NONE;
}